

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false,_true>_>
::~Matrix(Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false,_true>_>
          *this)

{
  Column_settings *pCVar1;
  pointer puVar2;
  pool<boost::default_user_allocator_malloc_free> *this_00;
  
  pCVar1 = this->colSettings_;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false,_true>_>_>_>_>
  ::_M_erase_at_end(&(this->matrix_).matrix_,
                    (this->matrix_).matrix_.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false,_true>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->matrix_).pivotToColumnIndex_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->matrix_).pivotToColumnIndex_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->matrix_).pivotToColumnIndex_.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar2;
  }
  (this->matrix_).nextIndex_ = 0;
  (this->matrix_).colSettings_ = pCVar1;
  this_00 = (pool<boost::default_user_allocator_malloc_free> *)this->colSettings_;
  if (this_00 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(this_00);
  }
  operator_delete(this_00,0x38);
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false,_true>_>_>
  ::~Chain_matrix(&this->matrix_);
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::~Matrix()
{
  matrix_.reset(colSettings_);
  delete colSettings_;
}